

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O2

void __thiscall sc_core::vcd_trace::compose_data_line(vcd_trace *this,char *rawdata,char *compdata)

{
  char *pcVar1;
  
  if (rawdata == compdata) {
    sc_assertion_failed("rawdata != compdata",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_vcd_trace.cpp"
                        ,0x90);
  }
  if (this->bit_width != 1) {
    if (this->bit_width == 0) {
      *compdata = '\0';
      return;
    }
    pcVar1 = strip_leading_bits(rawdata);
    sprintf(compdata,"b%s %s",pcVar1,(this->vcd_name)._M_dataplus._M_p);
    return;
  }
  *compdata = *rawdata;
  strcpy(compdata + 1,(this->vcd_name)._M_dataplus._M_p);
  return;
}

Assistant:

void
vcd_trace::compose_data_line(char* rawdata, char* compdata)
{
    sc_assert(rawdata != compdata);

    if(bit_width == 0)
    {
        compdata[0] = '\0';
    }
    else
    {
        if(bit_width == 1)
        {
            compdata[0] = rawdata[0];
            strcpy(&(compdata[1]), vcd_name.c_str());
        }
        else
        {
            const char* effective_begin = strip_leading_bits(rawdata);
            std::sprintf(compdata, "b%s %s", effective_begin, vcd_name.c_str());
        }
    }
}